

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxboundflippingrt.hpp
# Opt level: O2

void __thiscall
soplex::
SPxBoundFlippingRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::collectBreakpointsMax
          (SPxBoundFlippingRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           *this,int *nBp,int *minIdx,int *idx,int nnz,
          number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
          *upd,number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
               *vec,
          number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
          *upp,number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
               *low,BreakpointSource src)

{
  bool bVar1;
  int iVar2;
  int *piVar3;
  type_conflict5 tVar4;
  double *pdVar5;
  long lVar6;
  long lVar7;
  pointer pBVar8;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *pnVar9;
  cpp_dec_float<200U,_int,_void> *pcVar10;
  cpp_dec_float<200U,_int,_void> *pcVar11;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *pnVar12;
  pointer pBVar13;
  byte bVar14;
  int local_384;
  int *local_380;
  int local_374;
  cpp_dec_float<200U,_int,_void> *local_370;
  cpp_dec_float<200U,_int,_void> *local_368;
  Array<soplex::SPxBoundFlippingRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::Breakpoint>
  *local_360;
  int *local_358;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_350;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_348;
  int *local_340;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_338;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  y;
  cpp_dec_float<200U,_int,_void> local_238;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result_1;
  number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_130;
  cpp_dec_float<200U,_int,_void> local_b0;
  
  bVar14 = 0;
  local_338.m_backend.fpclass = cpp_dec_float_finite;
  local_338.m_backend.prec_elem = 0x1c;
  local_338.m_backend.data._M_elems[0] = 0;
  local_338.m_backend.data._M_elems[1] = 0;
  local_338.m_backend.data._M_elems[2] = 0;
  local_338.m_backend.data._M_elems[3] = 0;
  local_338.m_backend.data._M_elems[4] = 0;
  local_338.m_backend.data._M_elems[5] = 0;
  local_338.m_backend.data._M_elems[6] = 0;
  local_338.m_backend.data._M_elems[7] = 0;
  local_338.m_backend.data._M_elems[8] = 0;
  local_338.m_backend.data._M_elems[9] = 0;
  local_338.m_backend.data._M_elems[10] = 0;
  local_338.m_backend.data._M_elems[0xb] = 0;
  local_338.m_backend.data._M_elems[0xc] = 0;
  local_338.m_backend.data._M_elems[0xd] = 0;
  local_338.m_backend.data._M_elems[0xe] = 0;
  local_338.m_backend.data._M_elems[0xf] = 0;
  local_338.m_backend.data._M_elems[0x18] = 0;
  local_338.m_backend.data._M_elems[0x19] = 0;
  local_338.m_backend.data._M_elems._104_5_ = 0;
  local_338.m_backend.data._M_elems[0x1b]._1_3_ = 0;
  local_338.m_backend.exp = 0;
  local_338.m_backend.neg = false;
  local_338.m_backend.data._M_elems[0x10] = 0;
  local_338.m_backend.data._M_elems[0x11] = 0;
  local_338.m_backend.data._M_elems[0x12] = 0;
  local_338.m_backend.data._M_elems[0x13] = 0;
  local_338.m_backend.data._M_elems[0x14] = 0;
  local_338.m_backend.data._M_elems[0x15] = 0;
  local_338.m_backend.data._M_elems[0x16] = 0;
  local_338.m_backend.data._M_elems[0x17] = 0;
  local_380 = nBp;
  local_358 = minIdx;
  local_350 = upd;
  if (*nBp == 0) {
    pdVar5 = (double *)infinity();
    pBVar13 = (pointer)&local_b0;
    boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float<double>
              ((cpp_dec_float<200U,_int,_void> *)pBVar13,*pdVar5,(type *)0x0);
  }
  else {
    pBVar13 = (this->breakpoints).data.
              super__Vector_base<soplex::SPxBoundFlippingRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::Breakpoint,_std::allocator<soplex::SPxBoundFlippingRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::Breakpoint>_>
              ._M_impl.super__Vector_impl_data._M_start + *minIdx;
    pBVar8 = pBVar13;
    pcVar11 = &local_b0;
    for (lVar6 = 0x1c; lVar6 != 0; lVar6 = lVar6 + -1) {
      (pcVar11->data)._M_elems[0] = (pBVar8->val).m_backend.data._M_elems[0];
      pBVar8 = (pointer)((long)(pBVar8->val).m_backend.data._M_elems + 4);
      pcVar11 = (cpp_dec_float<200U,_int,_void> *)((pcVar11->data)._M_elems + 1);
    }
  }
  iVar2 = *(int *)((long)&(pBVar13->val).m_backend + 0x70);
  bVar1 = *(bool *)((long)&(pBVar13->val).m_backend + 0x74);
  pcVar11 = &local_b0;
  pnVar12 = &local_130;
  for (lVar6 = 0x1c; lVar6 != 0; lVar6 = lVar6 + -1) {
    (pnVar12->m_backend).data._M_elems[0] = (pcVar11->data)._M_elems[0];
    pcVar11 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar11 + ((ulong)bVar14 * -2 + 1) * 4);
    pnVar12 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
               *)((long)pnVar12 + ((ulong)bVar14 * -2 + 1) * 4);
  }
  local_130.m_backend.exp = iVar2;
  local_130.m_backend.neg = bVar1;
  local_130.m_backend._120_8_ = *(undefined8 *)((long)&(pBVar13->val).m_backend + 0x78);
  local_340 = idx + nnz;
  local_348 = &(this->
               super_SPxFastRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ).epsilon;
  local_368 = &(this->
               super_SPxFastRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               ).fastDelta.m_backend;
  local_360 = &this->breakpoints;
  local_370 = &result_1.m_backend;
  do {
    pnVar12 = local_348;
    lVar6 = 0x1c;
    if (local_340 <= idx) {
      return;
    }
    iVar2 = *idx;
    pnVar9 = local_350 + iVar2;
    pcVar11 = &local_b0;
    for (lVar7 = lVar6; lVar7 != 0; lVar7 = lVar7 + -1) {
      (((cpp_dec_float<200U,_int,_void> *)&pcVar11->data)->data)._M_elems[0] =
           (pnVar9->m_backend).data._M_elems[0];
      pnVar9 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                *)((long)pnVar9 + ((ulong)bVar14 * -2 + 1) * 4);
      pcVar11 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar11 + ((ulong)bVar14 * -2 + 1) * 4);
    }
    local_b0.exp = local_350[iVar2].m_backend.exp;
    local_b0.neg = local_350[iVar2].m_backend.neg;
    local_b0.fpclass = local_350[iVar2].m_backend.fpclass;
    local_b0.prec_elem = local_350[iVar2].m_backend.prec_elem;
    pnVar9 = local_348;
    pcVar11 = &y.m_backend;
    for (lVar7 = lVar6; lVar7 != 0; lVar7 = lVar7 + -1) {
      (pcVar11->data)._M_elems[0] = (pnVar9->m_backend).data._M_elems[0];
      pnVar9 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                *)((long)pnVar9 + (ulong)bVar14 * -8 + 4);
      pcVar11 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar11 + (ulong)bVar14 * -8 + 4);
    }
    y.m_backend.exp =
         (this->
         super_SPxFastRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
         ).epsilon.m_backend.exp;
    y.m_backend.neg =
         (this->
         super_SPxFastRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
         ).epsilon.m_backend.neg;
    y.m_backend.fpclass =
         (this->
         super_SPxFastRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
         ).epsilon.m_backend.fpclass;
    y.m_backend.prec_elem =
         (this->
         super_SPxFastRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
         ).epsilon.m_backend.prec_elem;
    local_374 = iVar2;
    tVar4 = boost::multiprecision::operator>
                      ((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                        *)&local_b0,
                       (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                        *)&y.m_backend);
    pcVar11 = &y.m_backend;
    if (tVar4) {
      pdVar5 = (double *)infinity();
      boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float<double>
                (&y.m_backend,*pdVar5,(type *)0x0);
      tVar4 = boost::multiprecision::operator<
                        ((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                          *)&upp[iVar2].m_backend,
                         (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                          *)&y.m_backend);
      if (tVar4) {
        y.m_backend.fpclass = cpp_dec_float_finite;
        y.m_backend.prec_elem = 0x1c;
        y.m_backend.data._M_elems[0] = 0;
        y.m_backend.data._M_elems[1] = 0;
        y.m_backend.data._M_elems[2] = 0;
        y.m_backend.data._M_elems[3] = 0;
        y.m_backend.data._M_elems[4] = 0;
        y.m_backend.data._M_elems[5] = 0;
        y.m_backend.data._M_elems[6] = 0;
        y.m_backend.data._M_elems[7] = 0;
        y.m_backend.data._M_elems[8] = 0;
        y.m_backend.data._M_elems[9] = 0;
        y.m_backend.data._M_elems[10] = 0;
        y.m_backend.data._M_elems[0xb] = 0;
        y.m_backend.data._M_elems[0xc] = 0;
        y.m_backend.data._M_elems[0xd] = 0;
        y.m_backend.data._M_elems[0xe] = 0;
        y.m_backend.data._M_elems[0xf] = 0;
        y.m_backend.data._M_elems[0x10] = 0;
        y.m_backend.data._M_elems[0x11] = 0;
        y.m_backend.data._M_elems[0x12] = 0;
        y.m_backend.data._M_elems[0x13] = 0;
        y.m_backend.data._M_elems[0x14] = 0;
        y.m_backend.data._M_elems[0x15] = 0;
        y.m_backend.data._M_elems[0x16] = 0;
        y.m_backend.data._M_elems[0x17] = 0;
        y.m_backend.data._M_elems[0x18] = 0;
        y.m_backend.data._M_elems[0x19] = 0;
        y.m_backend.data._M_elems._104_5_ = 0;
        y.m_backend.data._M_elems[0x1b]._1_3_ = 0;
        y.m_backend.exp = 0;
        y.m_backend.neg = false;
        boost::multiprecision::default_ops::
        eval_subtract_default<boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
                  (&y.m_backend,&upp[iVar2].m_backend,&vec[iVar2].m_backend);
        local_384 = 0;
        tVar4 = boost::multiprecision::operator<=
                          ((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                            *)&y.m_backend,&local_384);
        pcVar11 = local_370;
        pcVar10 = local_368;
        if (!tVar4) {
          result_1.m_backend.fpclass = cpp_dec_float_finite;
          result_1.m_backend.prec_elem = 0x1c;
          result_1.m_backend.data._M_elems[0] = 0;
          result_1.m_backend.data._M_elems[1] = 0;
          result_1.m_backend.data._M_elems[2] = 0;
          result_1.m_backend.data._M_elems[3] = 0;
          result_1.m_backend.data._M_elems[4] = 0;
          result_1.m_backend.data._M_elems[5] = 0;
          result_1.m_backend.data._M_elems[6] = 0;
          result_1.m_backend.data._M_elems[7] = 0;
          result_1.m_backend.data._M_elems[8] = 0;
          result_1.m_backend.data._M_elems[9] = 0;
          result_1.m_backend.data._M_elems[10] = 0;
          result_1.m_backend.data._M_elems[0xb] = 0;
          result_1.m_backend.data._M_elems[0xc] = 0;
          result_1.m_backend.data._M_elems[0xd] = 0;
          result_1.m_backend.data._M_elems[0xe] = 0;
          result_1.m_backend.data._M_elems[0xf] = 0;
          result_1.m_backend.data._M_elems[0x10] = 0;
          result_1.m_backend.data._M_elems[0x11] = 0;
          result_1.m_backend.data._M_elems[0x12] = 0;
          result_1.m_backend.data._M_elems[0x13] = 0;
          result_1.m_backend.data._M_elems[0x14] = 0;
          result_1.m_backend.data._M_elems[0x15] = 0;
          result_1.m_backend.data._M_elems[0x16] = 0;
          result_1.m_backend.data._M_elems[0x17] = 0;
          result_1.m_backend.data._M_elems[0x18] = 0;
          result_1.m_backend.data._M_elems[0x19] = 0;
          result_1.m_backend.data._M_elems._104_5_ = 0;
          result_1.m_backend.data._M_elems[0x1b]._1_3_ = 0;
          result_1.m_backend.exp = 0;
          result_1.m_backend.neg = false;
          boost::multiprecision::default_ops::
          eval_add_default<boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
                    (local_370,&y.m_backend,local_368);
          pcVar10 = pcVar11;
        }
        local_238.fpclass = cpp_dec_float_finite;
        local_238.prec_elem = 0x1c;
        local_238.data._M_elems[0] = 0;
        local_238.data._M_elems[1] = 0;
        local_238.data._M_elems[2] = 0;
        local_238.data._M_elems[3] = 0;
        local_238.data._M_elems[4] = 0;
        local_238.data._M_elems[5] = 0;
        local_238.data._M_elems[6] = 0;
        local_238.data._M_elems[7] = 0;
        local_238.data._M_elems[8] = 0;
        local_238.data._M_elems[9] = 0;
        local_238.data._M_elems[10] = 0;
        local_238.data._M_elems[0xb] = 0;
        local_238.data._M_elems[0xc] = 0;
        local_238.data._M_elems[0xd] = 0;
        local_238.data._M_elems[0xe] = 0;
        local_238.data._M_elems[0xf] = 0;
        local_238.data._M_elems[0x10] = 0;
        local_238.data._M_elems[0x11] = 0;
        local_238.data._M_elems[0x12] = 0;
        local_238.data._M_elems[0x13] = 0;
        local_238.data._M_elems[0x14] = 0;
        local_238.data._M_elems[0x15] = 0;
        local_238.data._M_elems[0x16] = 0;
        local_238.data._M_elems[0x17] = 0;
        local_238.data._M_elems[0x18] = 0;
        local_238.data._M_elems[0x19] = 0;
        local_238.data._M_elems._104_5_ = 0;
        local_238.data._M_elems[0x1b]._1_3_ = 0;
        local_238.exp = 0;
        local_238.neg = false;
        boost::multiprecision::default_ops::
        eval_divide_default<boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
                  (&local_238,pcVar10,&local_b0);
        lVar6 = 0x1c;
        pcVar11 = &local_238;
        pnVar12 = &local_338;
        for (lVar7 = lVar6; lVar7 != 0; lVar7 = lVar7 + -1) {
          (pnVar12->m_backend).data._M_elems[0] = (pcVar11->data)._M_elems[0];
          pcVar11 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar11 + (ulong)bVar14 * -8 + 4);
          pnVar12 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                     *)((long)pnVar12 + (ulong)bVar14 * -8 + 4);
        }
        local_338.m_backend.exp = local_238.exp;
        local_338.m_backend.neg = local_238.neg;
        local_338.m_backend.fpclass = local_238.fpclass;
        local_338.m_backend.prec_elem = local_238.prec_elem;
        pBVar13 = (local_360->data).
                  super__Vector_base<soplex::SPxBoundFlippingRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::Breakpoint,_std::allocator<soplex::SPxBoundFlippingRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::Breakpoint>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        pBVar13[*local_380].idx = local_374;
        iVar2 = *local_380;
        pBVar13[iVar2].src = src;
        pnVar12 = &local_338;
        pBVar8 = pBVar13 + iVar2;
        for (; lVar6 != 0; lVar6 = lVar6 + -1) {
          *(uint *)&(pBVar8->val).m_backend = (pnVar12->m_backend).data._M_elems[0];
          pnVar12 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                     *)((long)pnVar12 + (ulong)bVar14 * -8 + 4);
          pBVar8 = (pointer)((long)pBVar8 + ((ulong)bVar14 * -2 + 1) * 4);
        }
        *(int *)((long)&pBVar13[iVar2].val.m_backend + 0x70) = local_238.exp;
        *(bool *)((long)&pBVar13[iVar2].val.m_backend + 0x74) = local_238.neg;
        *(undefined8 *)((long)&pBVar13[iVar2].val.m_backend + 0x78) = local_238._120_8_;
LAB_00458feb:
        piVar3 = local_380;
        local_338.m_backend.exp = local_238.exp;
        local_338.m_backend.neg = local_238.neg;
        local_338.m_backend._120_8_ = local_238._120_8_;
        tVar4 = boost::multiprecision::operator<(&local_338,&local_130);
        iVar2 = *piVar3;
        if (tVar4) {
          pnVar12 = &local_338;
          pnVar9 = &local_130;
          for (lVar6 = 0x1c; lVar6 != 0; lVar6 = lVar6 + -1) {
            (pnVar9->m_backend).data._M_elems[0] = (pnVar12->m_backend).data._M_elems[0];
            pnVar12 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                       *)((long)pnVar12 + (ulong)bVar14 * -8 + 4);
            pnVar9 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                      *)((long)pnVar9 + ((ulong)bVar14 * -2 + 1) * 4);
          }
          local_130.m_backend.exp = local_338.m_backend.exp;
          local_130.m_backend.neg = local_338.m_backend.neg;
          local_130.m_backend.fpclass = local_338.m_backend.fpclass;
          local_130.m_backend.prec_elem = local_338.m_backend.prec_elem;
          *local_358 = iVar2;
        }
        *local_380 = iVar2 + 1;
      }
    }
    else {
      for (; lVar6 != 0; lVar6 = lVar6 + -1) {
        (pcVar11->data)._M_elems[0] = (pnVar12->m_backend).data._M_elems[0];
        pnVar12 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                   *)((long)pnVar12 + (ulong)bVar14 * -8 + 4);
        pcVar11 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar11 + (ulong)bVar14 * -8 + 4);
      }
      y.m_backend.exp =
           (this->
           super_SPxFastRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           ).epsilon.m_backend.exp;
      y.m_backend.neg =
           (this->
           super_SPxFastRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           ).epsilon.m_backend.neg;
      y.m_backend.fpclass =
           (this->
           super_SPxFastRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           ).epsilon.m_backend.fpclass;
      y.m_backend.prec_elem =
           (this->
           super_SPxFastRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           ).epsilon.m_backend.prec_elem;
      if (y.m_backend.fpclass != cpp_dec_float_finite || y.m_backend.data._M_elems[0] != 0) {
        y.m_backend.neg = (bool)(y.m_backend.neg ^ 1);
      }
      tVar4 = boost::multiprecision::operator<
                        ((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                          *)&local_b0,
                         (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                          *)&y.m_backend);
      if (tVar4) {
        pdVar5 = (double *)infinity();
        boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>::cpp_dec_float<double>
                  (&y.m_backend,-*pdVar5,(type *)0x0);
        tVar4 = boost::multiprecision::operator>
                          ((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                            *)&low[iVar2].m_backend,
                           (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                            *)&y.m_backend);
        if (tVar4) {
          y.m_backend.fpclass = cpp_dec_float_finite;
          y.m_backend.prec_elem = 0x1c;
          y.m_backend.data._M_elems[0] = 0;
          y.m_backend.data._M_elems[1] = 0;
          y.m_backend.data._M_elems[2] = 0;
          y.m_backend.data._M_elems[3] = 0;
          y.m_backend.data._M_elems[4] = 0;
          y.m_backend.data._M_elems[5] = 0;
          y.m_backend.data._M_elems[6] = 0;
          y.m_backend.data._M_elems[7] = 0;
          y.m_backend.data._M_elems[8] = 0;
          y.m_backend.data._M_elems[9] = 0;
          y.m_backend.data._M_elems[10] = 0;
          y.m_backend.data._M_elems[0xb] = 0;
          y.m_backend.data._M_elems[0xc] = 0;
          y.m_backend.data._M_elems[0xd] = 0;
          y.m_backend.data._M_elems[0xe] = 0;
          y.m_backend.data._M_elems[0xf] = 0;
          y.m_backend.data._M_elems[0x10] = 0;
          y.m_backend.data._M_elems[0x11] = 0;
          y.m_backend.data._M_elems[0x12] = 0;
          y.m_backend.data._M_elems[0x13] = 0;
          y.m_backend.data._M_elems[0x14] = 0;
          y.m_backend.data._M_elems[0x15] = 0;
          y.m_backend.data._M_elems[0x16] = 0;
          y.m_backend.data._M_elems[0x17] = 0;
          y.m_backend.data._M_elems[0x18] = 0;
          y.m_backend.data._M_elems[0x19] = 0;
          y.m_backend.data._M_elems._104_5_ = 0;
          y.m_backend.data._M_elems[0x1b]._1_3_ = 0;
          y.m_backend.exp = 0;
          y.m_backend.neg = false;
          boost::multiprecision::default_ops::
          eval_subtract_default<boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
                    (&y.m_backend,&low[iVar2].m_backend,&vec[iVar2].m_backend);
          local_384 = 0;
          tVar4 = boost::multiprecision::operator>=
                            ((number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                              *)&y.m_backend,&local_384);
          pcVar11 = local_370;
          if (tVar4) {
            pcVar10 = local_368;
            for (lVar6 = 0x1c; lVar6 != 0; lVar6 = lVar6 + -1) {
              (local_370->data)._M_elems[0] = (pcVar10->data)._M_elems[0];
              pcVar10 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar10 + (ulong)bVar14 * -8 + 4);
              local_370 = (cpp_dec_float<200U,_int,_void> *)
                          ((long)local_370 + (ulong)bVar14 * -8 + 4);
            }
            result_1.m_backend.exp =
                 (this->
                 super_SPxFastRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 ).fastDelta.m_backend.exp;
            result_1.m_backend.neg =
                 (this->
                 super_SPxFastRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 ).fastDelta.m_backend.neg;
            result_1.m_backend.fpclass =
                 (this->
                 super_SPxFastRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 ).fastDelta.m_backend.fpclass;
            result_1.m_backend.prec_elem =
                 (this->
                 super_SPxFastRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 ).fastDelta.m_backend.prec_elem;
            if (result_1.m_backend.fpclass != cpp_dec_float_finite ||
                result_1.m_backend.data._M_elems[0] != 0) {
              result_1.m_backend.neg = (bool)(result_1.m_backend.neg ^ 1);
            }
          }
          else {
            result_1.m_backend.fpclass = cpp_dec_float_finite;
            result_1.m_backend.prec_elem = 0x1c;
            result_1.m_backend.data._M_elems[0] = 0;
            result_1.m_backend.data._M_elems[1] = 0;
            result_1.m_backend.data._M_elems[2] = 0;
            result_1.m_backend.data._M_elems[3] = 0;
            result_1.m_backend.data._M_elems[4] = 0;
            result_1.m_backend.data._M_elems[5] = 0;
            result_1.m_backend.data._M_elems[6] = 0;
            result_1.m_backend.data._M_elems[7] = 0;
            result_1.m_backend.data._M_elems[8] = 0;
            result_1.m_backend.data._M_elems[9] = 0;
            result_1.m_backend.data._M_elems[10] = 0;
            result_1.m_backend.data._M_elems[0xb] = 0;
            result_1.m_backend.data._M_elems[0xc] = 0;
            result_1.m_backend.data._M_elems[0xd] = 0;
            result_1.m_backend.data._M_elems[0xe] = 0;
            result_1.m_backend.data._M_elems[0xf] = 0;
            result_1.m_backend.data._M_elems[0x10] = 0;
            result_1.m_backend.data._M_elems[0x11] = 0;
            result_1.m_backend.data._M_elems[0x12] = 0;
            result_1.m_backend.data._M_elems[0x13] = 0;
            result_1.m_backend.data._M_elems[0x14] = 0;
            result_1.m_backend.data._M_elems[0x15] = 0;
            result_1.m_backend.data._M_elems[0x16] = 0;
            result_1.m_backend.data._M_elems[0x17] = 0;
            result_1.m_backend.data._M_elems[0x18] = 0;
            result_1.m_backend.data._M_elems[0x19] = 0;
            result_1.m_backend.data._M_elems._104_5_ = 0;
            result_1.m_backend.data._M_elems[0x1b]._1_3_ = 0;
            result_1.m_backend.exp = 0;
            result_1.m_backend.neg = false;
            boost::multiprecision::default_ops::
            eval_subtract_default<boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
                      (local_370,&y.m_backend,local_368);
          }
          local_238.fpclass = cpp_dec_float_finite;
          local_238.prec_elem = 0x1c;
          local_238.data._M_elems[0] = 0;
          local_238.data._M_elems[1] = 0;
          local_238.data._M_elems[2] = 0;
          local_238.data._M_elems[3] = 0;
          local_238.data._M_elems[4] = 0;
          local_238.data._M_elems[5] = 0;
          local_238.data._M_elems[6] = 0;
          local_238.data._M_elems[7] = 0;
          local_238.data._M_elems[8] = 0;
          local_238.data._M_elems[9] = 0;
          local_238.data._M_elems[10] = 0;
          local_238.data._M_elems[0xb] = 0;
          local_238.data._M_elems[0xc] = 0;
          local_238.data._M_elems[0xd] = 0;
          local_238.data._M_elems[0xe] = 0;
          local_238.data._M_elems[0xf] = 0;
          local_238.data._M_elems[0x10] = 0;
          local_238.data._M_elems[0x11] = 0;
          local_238.data._M_elems[0x12] = 0;
          local_238.data._M_elems[0x13] = 0;
          local_238.data._M_elems[0x14] = 0;
          local_238.data._M_elems[0x15] = 0;
          local_238.data._M_elems[0x16] = 0;
          local_238.data._M_elems[0x17] = 0;
          local_238.data._M_elems[0x18] = 0;
          local_238.data._M_elems[0x19] = 0;
          local_238.data._M_elems._104_5_ = 0;
          local_238.data._M_elems[0x1b]._1_3_ = 0;
          local_238.exp = 0;
          local_238.neg = false;
          local_370 = pcVar11;
          boost::multiprecision::default_ops::
          eval_divide_default<boost::multiprecision::backends::cpp_dec_float<200u,int,void>>
                    (&local_238,pcVar11,&local_b0);
          lVar7 = 0x1c;
          pcVar11 = &local_238;
          pnVar12 = &local_338;
          for (lVar6 = lVar7; lVar6 != 0; lVar6 = lVar6 + -1) {
            (pnVar12->m_backend).data._M_elems[0] = (pcVar11->data)._M_elems[0];
            pcVar11 = (cpp_dec_float<200U,_int,_void> *)((long)pcVar11 + (ulong)bVar14 * -8 + 4);
            pnVar12 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                       *)((long)pnVar12 + (ulong)bVar14 * -8 + 4);
          }
          local_338.m_backend.exp = local_238.exp;
          local_338.m_backend.neg = local_238.neg;
          local_338.m_backend.fpclass = local_238.fpclass;
          local_338.m_backend.prec_elem = local_238.prec_elem;
          pBVar13 = (local_360->data).
                    super__Vector_base<soplex::SPxBoundFlippingRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::Breakpoint,_std::allocator<soplex::SPxBoundFlippingRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::Breakpoint>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          pBVar13[*local_380].idx = local_374;
          iVar2 = *local_380;
          pBVar13[iVar2].src = src;
          pnVar12 = &local_338;
          pBVar8 = pBVar13 + iVar2;
          for (; lVar7 != 0; lVar7 = lVar7 + -1) {
            *(uint *)&(pBVar8->val).m_backend = (pnVar12->m_backend).data._M_elems[0];
            pnVar12 = (number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                       *)((long)pnVar12 + (ulong)bVar14 * -8 + 4);
            pBVar8 = (pointer)((long)pBVar8 + ((ulong)bVar14 * -2 + 1) * 4);
          }
          *(int *)((long)&pBVar13[iVar2].val.m_backend + 0x70) = local_238.exp;
          *(bool *)((long)&pBVar13[iVar2].val.m_backend + 0x74) = local_238.neg;
          *(undefined8 *)((long)&pBVar13[iVar2].val.m_backend + 0x78) = local_238._120_8_;
          goto LAB_00458feb;
        }
      }
    }
    if ((int)(((long)(this->breakpoints).data.
                     super__Vector_base<soplex::SPxBoundFlippingRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::Breakpoint,_std::allocator<soplex::SPxBoundFlippingRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::Breakpoint>_>
                     ._M_impl.super__Vector_impl_data._M_finish -
              (long)(this->breakpoints).data.
                    super__Vector_base<soplex::SPxBoundFlippingRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::Breakpoint,_std::allocator<soplex::SPxBoundFlippingRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::Breakpoint>_>
                    ._M_impl.super__Vector_impl_data._M_start) / 0x88) <= *local_380) {
      Array<soplex::SPxBoundFlippingRT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<200U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>::Breakpoint>
      ::reSize(local_360,*local_380 * 2);
    }
    idx = idx + 1;
  } while( true );
}

Assistant:

void SPxBoundFlippingRT<R>::collectBreakpointsMax(
   int&                  nBp,                /**< number of found breakpoints so far */
   int&                  minIdx,             /**< index to current minimal breakpoint */
   const int*            idx,                /**< pointer to indices of current VectorBase<R> */
   int                   nnz,                /**< number of nonzeros in current VectorBase<R> */
   const R*           upd,                /**< pointer to update values of current VectorBase<R> */
   const R*           vec,                /**< pointer to values of current VectorBase<R> */
   const R*           upp,                /**< pointer to upper bound/rhs of current VectorBase<R> */
   const R*           low,                /**< pointer to lower bound/lhs of current VectorBase<R> */
   BreakpointSource      src                 /**< type of VectorBase<R> (pVec, coPvec or fVec)*/
)
{
   R minVal;
   R curVal;
   const int* last;

   minVal = (nBp == 0) ? R(infinity) : breakpoints[minIdx].val;

   last = idx + nnz;

   for(; idx < last; ++idx)
   {
      int i = *idx;
      R x = upd[i];

      if(x > this->epsilonZero())
      {
         if(upp[i] < R(infinity))
         {
            R y = upp[i] - vec[i];
            curVal = (y <= 0) ? this->fastDelta / x : (y + this->fastDelta) / x;
            assert(curVal > 0);

            breakpoints[nBp].idx = i;
            breakpoints[nBp].src = src;
            breakpoints[nBp].val = curVal;

            if(curVal < minVal)
            {
               minVal = curVal;
               minIdx = nBp;
            }

            nBp++;
         }
      }
      else if(x < -this->epsilonZero())
      {
         if(low[i] > R(-infinity))
         {
            R y = low[i] - vec[i];
            curVal = (y >= 0) ? -this->fastDelta / x : (y - this->fastDelta) / x;
            assert(curVal > 0);

            breakpoints[nBp].idx = i;
            breakpoints[nBp].src = src;
            breakpoints[nBp].val = curVal;

            if(curVal < minVal)
            {
               minVal = curVal;
               minIdx = nBp;
            }

            nBp++;
         }
      }

      if(nBp >= breakpoints.size())
         breakpoints.reSize(nBp * 2);
   }

   return;
}